

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.cpp
# Opt level: O3

void __thiscall
OpenMD::StuntDouble::StuntDouble(StuntDouble *this,ObjectType objType,DataStoragePointer storage)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_StuntDouble = (_func_int **)&PTR__StuntDouble_0022a398;
  this->objType_ = objType;
  this->storage_ = storage;
  this->snapshotMan_ = (SnapshotManager *)0x0;
  this->linear_ = false;
  this->linearAxis_ = -1;
  this->globalIndex_ = -1;
  this->globalIntegrableObjectIndex_ = -1;
  this->localIndex_ = -1;
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_00228380;
  p_Var1 = &(this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->properties_).propMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

StuntDouble::StuntDouble(ObjectType objType, DataStoragePointer storage) :
      objType_(objType), storage_(storage), snapshotMan_(NULL), linear_(false),
      linearAxis_(-1), globalIndex_(-1), globalIntegrableObjectIndex_(-1),
      localIndex_(-1) {}